

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxProjection.cpp
# Opt level: O0

double __thiscall BoxProjection::coordinateZ(BoxProjection *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  int G_local;
  int L_local;
  int K_local;
  int J_local;
  BoxProjection *this_local;
  
  switch(G) {
  case 0:
    (this->super_Parameterization).x =
         (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z = (this->super_Parameterization).z_lb;
    break;
  case 1:
    (this->super_Parameterization).x =
         -(double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_ub;
    (this->super_Parameterization).y = (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z =
         (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    break;
  case 2:
    (this->super_Parameterization).x = (this->super_Parameterization).x_lb;
    (this->super_Parameterization).y =
         (double)J * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z =
         (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    break;
  case 3:
    (this->super_Parameterization).x =
         -(double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_ub;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z = (this->super_Parameterization).z_ub;
    break;
  case 4:
    (this->super_Parameterization).x =
         (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).y = (this->super_Parameterization).y_ub;
    (this->super_Parameterization).z =
         (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    break;
  case 5:
    (this->super_Parameterization).x = (this->super_Parameterization).x_ub;
    (this->super_Parameterization).y =
         -(double)J * (this->super_Parameterization).dy + (this->super_Parameterization).y_ub;
    (this->super_Parameterization).z =
         (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
  }
  dVar1 = (this->super_Parameterization).z;
  dVar2 = projection(this,(this->super_Parameterization).x,(this->super_Parameterization).y,
                     (this->super_Parameterization).z);
  return dVar1 * dVar2;
}

Assistant:

double BoxProjection::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Lower z
      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;
      break;
    case 1:  // Lower y
      x = x_ub - (double)J * dx;
      y = y_lb;
      z = z_lb + (double)K * dz;
      break;
    case 2:  // Lower x
      x = x_lb;
      y = y_lb + (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
    case 3:  // Upper z
      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;
      break;
    case 4:  // Upper y
      x = x_lb + (double)J * dx;
      y = y_ub;
      z = z_lb + (double)K * dz;
      break;
    case 5:  // Upper x
      x = x_ub;
      y = y_ub - (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
  }

  return z * projection(x, y, z);
}